

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O0

int __thiscall ncnn::Quantize::forward(Quantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  char cVar2;
  float *pfVar3;
  Mat *in_RDX;
  Mat *in_RSI;
  undefined8 in_RDI;
  int i_2;
  char *outptr_2;
  float *ptr_2;
  int q;
  int size_1;
  int channels;
  int h_1;
  int w_2;
  int i_1;
  char *outptr_1;
  float *ptr_1;
  int size;
  int h;
  int w_1;
  int i;
  char *outptr;
  float *ptr;
  int w;
  int dims;
  Mat *in_stack_fffffffffffffec0;
  Allocator *in_stack_fffffffffffffec8;
  Mat *this_00;
  size_t in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar4;
  Mat local_118;
  Mat *local_d8;
  Mat local_c0;
  float *local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  char *local_60;
  float *local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  char *local_40;
  float *local_38;
  int local_30;
  int local_2c;
  Mat *local_20;
  Mat *local_18;
  
  local_2c = in_RSI->dims;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (local_2c == 1) {
    local_30 = in_RSI->w;
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    bVar1 = Mat::empty(in_stack_fffffffffffffec0);
    if (bVar1) {
      return -100;
    }
    local_38 = Mat::operator_cast_to_float_(local_18);
    local_40 = Mat::operator_cast_to_signed_char_(local_20);
    for (local_44 = 0; local_44 < local_30; local_44 = local_44 + 1) {
      cVar2 = float2int8(SUB84(in_stack_fffffffffffffec0,0));
      local_40[local_44] = cVar2;
    }
  }
  if (local_2c == 2) {
    local_48 = local_18->w;
    local_4c = local_18->h;
    local_50 = local_48 * local_4c;
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffed0,
                in_stack_fffffffffffffec8);
    bVar1 = Mat::empty(in_stack_fffffffffffffec0);
    if (bVar1) {
      return -100;
    }
    local_58 = Mat::operator_cast_to_float_(local_18);
    local_60 = Mat::operator_cast_to_signed_char_(local_20);
    for (local_64 = 0; local_64 < local_50; local_64 = local_64 + 1) {
      cVar2 = float2int8(SUB84(in_stack_fffffffffffffec0,0));
      local_60[local_64] = cVar2;
    }
  }
  if (local_2c == 3) {
    local_68 = local_18->w;
    local_6c = local_18->h;
    local_70 = local_18->c;
    local_74 = local_68 * local_6c;
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)(in_stack_fffffffffffffed0 >> 0x20),
                (size_t)in_stack_fffffffffffffec8,(Allocator *)in_stack_fffffffffffffec0);
    bVar1 = Mat::empty(in_stack_fffffffffffffec0);
    if (bVar1) {
      return -100;
    }
    for (local_78 = 0; iVar4 = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20), local_78 < local_70;
        local_78 = local_78 + 1) {
      this_00 = &local_c0;
      Mat::channel(this_00,iVar4);
      pfVar3 = Mat::operator_cast_to_float_(this_00);
      Mat::~Mat((Mat *)0x1ad940);
      local_80 = pfVar3;
      Mat::channel(this_00,iVar4);
      in_stack_fffffffffffffec0 = (Mat *)Mat::operator_cast_to_signed_char_(&local_118);
      Mat::~Mat((Mat *)0x1ad984);
      local_d8 = in_stack_fffffffffffffec0;
      for (iVar4 = 0; iVar4 < local_74; iVar4 = iVar4 + 1) {
        cVar2 = float2int8(SUB84(in_stack_fffffffffffffec0,0));
        *(char *)((long)&local_d8->data + (long)iVar4) = cVar2;
      }
    }
  }
  return 0;
}

Assistant:

int Quantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<w; i++)
        {
            outptr[i] = float2int8(ptr[i] * scale);
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int size = w * h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<size; i++)
        {
            outptr[i] = float2int8(ptr[i] * scale);
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            signed char* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
    }

    return 0;
}